

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O1

NodeRef __thiscall slang::IntervalMapDetails::Path::getLeftSibling(Path *this,uint32_t level)

{
  uint32_t uVar1;
  pointer pEVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  NodeRef NVar6;
  int iVar7;
  uint32_t uVar8;
  uint uVar9;
  
  uVar5 = 0;
  uVar3 = level - 1;
  iVar4 = 0;
  do {
    iVar7 = iVar4;
    uVar9 = uVar3;
    if (uVar9 == 0) {
      uVar8 = 1;
      goto LAB_003cfabb;
    }
    uVar3 = uVar9 - 1;
    iVar4 = iVar7 + 1;
  } while ((this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_[uVar9].
           offset == 0);
  uVar8 = uVar9 + 1;
  uVar5 = uVar9;
LAB_003cfabb:
  pEVar2 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar1 = pEVar2[uVar5].offset;
  if (uVar1 != 0) {
    NVar6.pip.value =
         *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
          ((long)pEVar2[uVar5].node + (ulong)(uVar1 - 1) * 8);
    if (uVar8 != level) {
      do {
        NVar6.pip.value =
             *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
              (((ulong)NVar6.pip.value & 0xffffffffffffffc0) +
              (ulong)(SUB84(NVar6.pip.value,0) & 0x3f) * 8);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    return (NodeRef)NVar6.pip.value;
  }
  return (NodeRef)0;
}

Assistant:

NodeRef Path::getLeftSibling(uint32_t level) const {
    SLANG_ASSERT(level > 0);

    // Go up until we can go left.
    uint32_t l = level - 1;
    while (l && path[l].offset == 0)
        --l;

    // If we hit the root there is no left sibling.
    if (path[l].offset == 0)
        return NodeRef();

    // Start with left subtree and go down to the right
    // until we reach the original level.
    NodeRef node = path[l].childAt(path[l].offset - 1);
    for (++l; l != level; ++l)
        node = node.childAt(node.size() - 1);
    return node;
}